

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void archive_acl_clear(archive_acl *acl)

{
  undefined8 uVar1;
  long in_RDI;
  archive_acl_entry *ap;
  
  while (*(long *)(in_RDI + 8) != 0) {
    uVar1 = **(undefined8 **)(in_RDI + 8);
    archive_mstring_clean((archive_mstring *)0x2bc788);
    free(*(void **)(in_RDI + 8));
    *(undefined8 *)(in_RDI + 8) = uVar1;
  }
  if (*(long *)(in_RDI + 0x20) != 0) {
    free(*(void **)(in_RDI + 0x20));
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  if (*(long *)(in_RDI + 0x28) != 0) {
    free(*(void **)(in_RDI + 0x28));
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  return;
}

Assistant:

void
archive_acl_clear(struct archive_acl *acl)
{
	struct archive_acl_entry *ap;

	while (acl->acl_head != NULL) {
		ap = acl->acl_head->next;
		archive_mstring_clean(&acl->acl_head->name);
		free(acl->acl_head);
		acl->acl_head = ap;
	}
	if (acl->acl_text_w != NULL) {
		free(acl->acl_text_w);
		acl->acl_text_w = NULL;
	}
	if (acl->acl_text != NULL) {
		free(acl->acl_text);
		acl->acl_text = NULL;
	}
	acl->acl_p = NULL;
	acl->acl_state = 0; /* Not counting. */
}